

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O2

void Rwt_ManIncTravId(Rwt_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = p->nTravIds;
  p->nTravIds = uVar1 + 1;
  if (0x8ffffffe < uVar1) {
    pVVar2 = p->vForest;
    uVar1 = pVVar2->nSize;
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      *(undefined4 *)((long)pVVar2->pArray[uVar4] + 4) = 0;
    }
    p->nTravIds = 1;
  }
  return;
}

Assistant:

void Rwt_ManIncTravId( Rwt_Man_t * p )
{
    Rwt_Node_t * pNode;
    int i;
    if ( p->nTravIds++ < 0x8FFFFFFF )
        return;
    Vec_PtrForEachEntry( Rwt_Node_t *, p->vForest, pNode, i )
        pNode->TravId = 0;
    p->nTravIds = 1;
}